

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffIf(NodeDiffComputer *this,IfStatement *lhs,IfStatement *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  Node *lhs_00;
  Node *rhs_00;
  IfStatement *in_RDX;
  IfStatement *in_RSI;
  NodeDiffComputer *in_RDI;
  int32_t elseDiff;
  int32_t thenDiff;
  int32_t condDiff;
  Node *in_stack_ffffffffffffffb8;
  int32_t local_4;
  
  lhs_00 = &IfStatement::condition(in_RSI)->super_Node;
  IfStatement::condition(in_RDX);
  iVar1 = diffNodes(in_RDI,lhs_00,in_stack_ffffffffffffffb8);
  local_4 = iVar1;
  if (iVar1 <= in_RDI->limit) {
    rhs_00 = &IfStatement::thenBranch(in_RSI)->super_Node;
    IfStatement::thenBranch(in_RDX);
    iVar2 = diffNodes(in_RDI,lhs_00,rhs_00);
    local_4 = iVar2;
    if (iVar2 <= in_RDI->limit) {
      IfStatement::elseBranch(in_RSI);
      IfStatement::elseBranch(in_RDX);
      local_4 = diffNodes(in_RDI,lhs_00,rhs_00);
      if (local_4 <= in_RDI->limit) {
        local_4 = iVar1 + iVar2 + local_4;
      }
    }
  }
  return local_4;
}

Assistant:

int32_t diffIf(const IfStatement *lhs, const IfStatement *rhs) {

    int32_t condDiff = diffNodes(lhs->condition(), rhs->condition());

    if (condDiff > limit)
      return condDiff;

    int32_t thenDiff = diffNodes(lhs->thenBranch(), rhs->thenBranch());

    if (thenDiff > limit)
      return thenDiff;

    int32_t elseDiff = diffNodes(lhs->elseBranch(), rhs->elseBranch());

    if (elseDiff > limit)
      return elseDiff;

    return condDiff + thenDiff + elseDiff;
  }